

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O1

int IDARcheck1(IDAMem IDA_mem)

{
  double dVar1;
  double dVar2;
  int *piVar3;
  sunrealtype *psVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  
  if (0 < IDA_mem->ida_nrtfn) {
    piVar3 = IDA_mem->ida_iroots;
    lVar7 = 0;
    do {
      piVar3[lVar7] = 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 < IDA_mem->ida_nrtfn);
  }
  dVar1 = IDA_mem->ida_tn;
  IDA_mem->ida_tlo = dVar1;
  IDA_mem->ida_ttol = (ABS(IDA_mem->ida_hh) + ABS(dVar1)) * IDA_mem->ida_uround * 100.0;
  iVar6 = (*IDA_mem->ida_gfun)
                    (dVar1,IDA_mem->ida_phi[0],IDA_mem->ida_phi[1],IDA_mem->ida_glo,
                     IDA_mem->ida_user_data);
  IDA_mem->ida_nge = 1;
  iVar8 = -10;
  if (iVar6 == 0) {
    if (0 < IDA_mem->ida_nrtfn) {
      psVar4 = IDA_mem->ida_glo;
      lVar7 = 0;
      bVar5 = false;
      do {
        if ((psVar4[lVar7] == 0.0) && (!NAN(psVar4[lVar7]))) {
          IDA_mem->ida_gactive[lVar7] = 0;
          bVar5 = true;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < IDA_mem->ida_nrtfn);
      if (bVar5) {
        dVar1 = IDA_mem->ida_hh;
        dVar9 = IDA_mem->ida_ttol / ABS(dVar1);
        if (dVar9 <= 0.1) {
          dVar9 = 0.1;
        }
        dVar2 = IDA_mem->ida_tlo;
        N_VLinearSum(0x3ff0000000000000,IDA_mem->ida_phi[0],IDA_mem->ida_phi[1],IDA_mem->ida_yy);
        iVar6 = (*IDA_mem->ida_gfun)
                          (dVar2 + dVar9 * dVar1,IDA_mem->ida_yy,IDA_mem->ida_phi[1],
                           IDA_mem->ida_ghi,IDA_mem->ida_user_data);
        IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
        if (iVar6 != 0) {
          return -10;
        }
        if (IDA_mem->ida_nrtfn < 1) {
          return 0;
        }
        piVar3 = IDA_mem->ida_gactive;
        lVar7 = 0;
        do {
          if (piVar3[lVar7] == 0) {
            dVar1 = IDA_mem->ida_ghi[lVar7];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              piVar3[lVar7] = 1;
              IDA_mem->ida_glo[lVar7] = dVar1;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < IDA_mem->ida_nrtfn);
      }
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int IDARcheck1(IDAMem IDA_mem)
{
  int i, retval;
  sunrealtype smallh, hratio, tplus;
  sunbooleantype zroot;

  for (i = 0; i < IDA_mem->ida_nrtfn; i++) { IDA_mem->ida_iroots[i] = 0; }
  IDA_mem->ida_tlo  = IDA_mem->ida_tn;
  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);

  /* Evaluate g at initial t and check for zero values. */
  retval           = IDA_mem->ida_gfun(IDA_mem->ida_tlo, IDA_mem->ida_phi[0],
                                       IDA_mem->ida_phi[1], IDA_mem->ida_glo,
                                       IDA_mem->ida_user_data);
  IDA_mem->ida_nge = 1;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  zroot = SUNFALSE;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (SUNRabs(IDA_mem->ida_glo[i]) == ZERO)
    {
      zroot                   = SUNTRUE;
      IDA_mem->ida_gactive[i] = SUNFALSE;
    }
  }
  if (!zroot) { return (IDA_SUCCESS); }

  /* Some g_i is zero at t0; look at g at t0+(small increment). */
  hratio = SUNMAX(IDA_mem->ida_ttol / SUNRabs(IDA_mem->ida_hh), PT1);
  smallh = hratio * IDA_mem->ida_hh;
  tplus  = IDA_mem->ida_tlo + smallh;
  N_VLinearSum(ONE, IDA_mem->ida_phi[0], smallh, IDA_mem->ida_phi[1],
               IDA_mem->ida_yy);
  retval = IDA_mem->ida_gfun(tplus, IDA_mem->ida_yy, IDA_mem->ida_phi[1],
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  /* We check now only the components of g which were exactly 0.0 at t0
   * to see if we can 'activate' them. */
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i] && SUNRabs(IDA_mem->ida_ghi[i]) != ZERO)
    {
      IDA_mem->ida_gactive[i] = SUNTRUE;
      IDA_mem->ida_glo[i]     = IDA_mem->ida_ghi[i];
    }
  }
  return (IDA_SUCCESS);
}